

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O2

uint64_t absl::lts_20250127::hash_internal::MixingHashState::CombineLargeContiguousImpl32
                   (uint64_t state,uchar *first,size_t len)

{
  undefined1 auVar1 [16];
  uint32_t uVar2;
  uint64_t uVar3;
  
  while (0x3ff < len) {
    uVar2 = CityHash32((char *)first,0x400);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = state ^ uVar2;
    state = SUB168(auVar1 * ZEXT816(0xdcb22ca68cb134ed),8) ^
            SUB168(auVar1 * ZEXT816(0xdcb22ca68cb134ed),0);
    first = first + 0x400;
    len = len - 0x400;
  }
  uVar3 = CombineContiguousImpl(state,first,len);
  return uVar3;
}

Assistant:

uint64_t MixingHashState::CombineLargeContiguousImpl32(
    uint64_t state, const unsigned char* first, size_t len) {
  while (len >= PiecewiseChunkSize()) {
    state = Mix(
        state ^ hash_internal::CityHash32(reinterpret_cast<const char*>(first),
                                          PiecewiseChunkSize()),
        kMul);
    len -= PiecewiseChunkSize();
    first += PiecewiseChunkSize();
  }
  // Handle the remainder.
  return CombineContiguousImpl(state, first, len,
                               std::integral_constant<int, 4>{});
}